

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O2

void __thiscall jrtplib::RTPSources::ClearSourceList(RTPSources *this)

{
  HashElement *pHVar1;
  HashElement *pHVar2;
  
  pHVar2 = (this->sourcelist).firsthashelem;
  (this->sourcelist).curhashelem = pHVar2;
  while (pHVar2 != (HashElement *)0x0) {
    RTPDelete<jrtplib::RTPInternalSourceData>(pHVar2->element,(this->super_RTPMemoryObject).mgr);
    pHVar1 = (this->sourcelist).curhashelem;
    pHVar2 = (HashElement *)0x0;
    if (pHVar1 != (HashElement *)0x0) {
      pHVar2 = pHVar1->listnext;
      (this->sourcelist).curhashelem = pHVar2;
    }
  }
  RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPInternalSourceData_*,_jrtplib::RTPSources_GetHashIndex,_8317>
  ::Clear(&this->sourcelist);
  this->owndata = (RTPInternalSourceData *)0x0;
  this->sendercount = 0;
  this->totalcount = 0;
  this->activecount = 0;
  return;
}

Assistant:

void RTPSources::ClearSourceList()
{
	sourcelist.GotoFirstElement();
	while (sourcelist.HasCurrentElement())
	{
		RTPInternalSourceData *sourcedata;

		sourcedata = sourcelist.GetCurrentElement();
		RTPDelete(sourcedata,GetMemoryManager());
		sourcelist.GotoNextElement();
	}
	sourcelist.Clear();
	owndata = 0;
	totalcount = 0;
	sendercount = 0;
	activecount = 0;
}